

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall IF97::BaseRegion::dgammar_dPI(BaseRegion *this,double T,double p)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  (*this->_vptr_BaseRegion[3])(p);
  (*this->_vptr_BaseRegion[4])(T);
  piVar2 = (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = (long)(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar5 == 0) {
    dVar8 = 0.0;
  }
  else {
    lVar5 = lVar5 >> 2;
    dVar8 = 0.0;
    lVar6 = 0;
    do {
      iVar1 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      dVar9 = 1.0;
      uVar7 = iVar1 - 1;
      if (uVar7 != 0) {
        uVar4 = -uVar7;
        if (0 < (int)uVar7) {
          uVar4 = uVar7;
        }
        dVar10 = 1.0 / extraout_XMM0_Qa;
        if (0 < iVar1) {
          dVar10 = extraout_XMM0_Qa;
        }
        dVar9 = 1.0;
        do {
          if ((uVar4 & 1) != 0) {
            dVar9 = dVar9 * dVar10;
          }
          dVar10 = dVar10 * dVar10;
          bVar3 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
        } while (bVar3);
      }
      uVar7 = piVar2[lVar6];
      dVar10 = 1.0;
      if (uVar7 != 0) {
        uVar4 = -uVar7;
        if (0 < (int)uVar7) {
          uVar4 = uVar7;
        }
        dVar11 = 1.0 / extraout_XMM0_Qa_00;
        if (-1 < (int)uVar7) {
          dVar11 = extraout_XMM0_Qa_00;
        }
        dVar10 = 1.0;
        do {
          if ((uVar4 & 1) != 0) {
            dVar10 = dVar10 * dVar11;
          }
          dVar11 = dVar11 * dVar11;
          bVar3 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
        } while (bVar3);
      }
      dVar8 = dVar8 + (double)iVar1 *
                      (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6] * dVar9 * dVar10;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
  }
  return dVar8;
}

Assistant:

double dgammar_dPI(double T, double p) const{
            const double _PI = PIrterm(p), _TAU = TAUrterm(T);
            double summer = 0;
            for (std::size_t i = 0; i < Jr.size(); ++i){
                summer += nr[i]*Ir[i]*powi(_PI, Ir[i]-1)*powi(_TAU, Jr[i]);
            }
            return summer;
        }